

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageFlipHorizontal(Image *image)

{
  int iVar1;
  void *pvVar2;
  int local_2c;
  int local_28;
  int i;
  int x;
  int y;
  uchar *flippedData;
  int bytesPerPixel;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      iVar1 = GetPixelDataSize(1,1,image->format);
      pvVar2 = malloc((long)(image->width * image->height * iVar1));
      for (i = 0; i < image->height; i = i + 1) {
        for (local_28 = 0; local_28 < image->width; local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
            *(undefined1 *)((long)pvVar2 + (long)((i * image->width + local_28) * iVar1 + local_2c))
                 = *(undefined1 *)
                    ((long)image->data +
                    (long)((i * image->width + ((image->width + -1) - local_28)) * iVar1 + local_2c)
                    );
          }
        }
      }
      free(image->data);
      image->data = pvVar2;
    }
    else {
      TraceLog(4,"Image manipulation not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageFlipHorizontal(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                // OPTION 1: Move pixels with memcopy()
                //memcpy(flippedData + (y*image->width + x)*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - 1 - x))*bytesPerPixel, bytesPerPixel);

                // OPTION 2: Just copy data pixel by pixel
                for (int i = 0; i < bytesPerPixel; i++) flippedData[(y*image->width + x)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - 1 - x))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = flippedData;

        /*
        // OPTION 3: Faster implementation (specific for 32bit pixels)
        // NOTE: It does not require additional allocations
        uint32_t *ptr = (uint32_t *)image->data;
        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width/2; x++)
            {
                uint32_t backup = ptr[y*image->width + x];
                ptr[y*image->width + x] = ptr[y*image->width + (image->width - 1 - x)];
                ptr[y*image->width + (image->width - 1 - x)] = backup;
            }
        }
        */
    }
}